

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O1

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_4fColor OVar5;
  ON_4fColor col;
  ON_4fColor colDark;
  ON_4fColor local_38;
  ON_4fColor local_28;
  ON_4fColor local_18;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  
  ON_4fColor::ON_4fColor(&local_28,0,0,0x40,0xff);
  if (-3.0 <= altitude) {
    dVar4 = altitude;
    if (altitude <= 0.0) {
      dVar4 = 0.0;
    }
    dVar4 = pow(dVar4,1.5);
    dVar4 = dVar4 * 30.0 + 500.0;
    if (5300.0 <= dVar4) {
      dVar4 = 5300.0;
    }
    dVar2 = pow(2.718281828459045,14388.0 / (dVar4 * 0.6));
    dVar1 = 12.86008230452675 / (dVar2 + -1.0);
    dVar2 = pow(2.718281828459045,14388.0 / (dVar4 * 0.56));
    dVar2 = 18.15765938299517 / (dVar2 + -1.0);
    dVar4 = pow(2.718281828459045,14388.0 / (dVar4 * 0.44));
    dVar3 = 60.63684795499562 / (dVar4 + -1.0);
    dVar4 = dVar3;
    if (dVar3 <= dVar2) {
      dVar4 = dVar2;
    }
    if (dVar4 <= dVar1) {
      dVar4 = dVar1;
    }
    dVar4 = 1.0 / dVar4;
    dVar1 = dVar1 * dVar4;
    dVar2 = (dVar2 * dVar4) / 0.9999792082903474;
    dVar3 = (dVar4 * dVar3) / 0.8186678088180299;
    dVar4 = dVar3;
    if (dVar3 <= dVar2) {
      dVar4 = dVar2;
    }
    if (dVar4 <= dVar1) {
      dVar4 = dVar1;
    }
    dVar4 = 1.0 / dVar4;
    dVar1 = pow(dVar1 * dVar4,0.15);
    dVar2 = pow(dVar2 * dVar4,0.15);
    dVar4 = pow(dVar4 * dVar3,0.15);
    ON_4fColor::ON_4fColor(&local_18,(float)dVar1,(float)dVar2,(float)dVar4,1.0);
    local_38.m_color[0] = local_18.m_color[0];
    local_38.m_color[1] = local_18.m_color[1];
    local_38.m_color[2] = local_18.m_color[2];
    local_38.m_color[3] = local_18.m_color[3];
    if (altitude < 0.0) {
      ON_4fColor::BlendTo(&local_38,(float)(altitude / -3.0),&local_28,false);
    }
  }
  else {
    local_38.m_color[0] = local_28.m_color[0];
    local_38.m_color[1] = local_28.m_color[1];
    local_38.m_color[2] = local_28.m_color[2];
    local_38.m_color[3] = local_28.m_color[3];
  }
  OVar5.m_color[0] = local_38.m_color[0];
  auVar6._4_4_ = local_38.m_color[1];
  register0x00001240 = local_38.m_color[2];
  register0x00001244 = local_38.m_color[3];
  return (ON_4fColor)OVar5.m_color;
}

Assistant:

ON_4fColor ON_Sun::SunColorFromAltitude(double altitude) // Static.
{
  ON_4fColor colDark(0, 0, 64, 255);

  if (altitude < -TwilightZone())
    return colDark;

  const double value = (30.0 * pow(std::max(0.0, altitude), 1.5)) + 500.0;
  auto temperature = std::min(5300.0, value);

  ON_4fColor col = ColorTemperature(temperature);

  if (altitude < 0.0)
  {
    const double dBlend = -altitude / TwilightZone();
    col.BlendTo(float(dBlend), colDark);
  }

  return col;
}